

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rambunctious-recitation.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  byte bVar1;
  value_type vVar2;
  ostream *poVar3;
  vector<int,_std::allocator<int>_> local_308;
  int local_2ec;
  undefined1 local_2e8 [4];
  value_type a2;
  int local_2cc;
  undefined1 local_2c8 [4];
  value_type a1;
  int local_2a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  int local_27c;
  size_type local_278;
  size_type to;
  size_t pos;
  vector<int,_std::allocator<int>_> numbers;
  string input;
  istream local_220 [8];
  ifstream file;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (argc == 2) {
    std::ifstream::ifstream(local_220,argv[1],8);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"Could not open file\n");
      argv_local._4_4_ = 1;
    }
    else {
      this = &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage;
      std::__cxx11::string::string((string *)this);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,(string *)this);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&pos);
      to = 0;
      local_278 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,',',0);
      while (local_278 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,to,local_278 - to);
        local_27c = std::__cxx11::stoi(&local_2a0,(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&pos,&local_27c);
        std::__cxx11::string::~string((string *)&local_2a0);
        to = local_278 + 1;
        local_278 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,',',to);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,to,0xffffffffffffffff);
      local_2a4 = std::__cxx11::stoi((string *)local_2c8,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&pos,&local_2a4);
      std::__cxx11::string::~string((string *)local_2c8);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_2e8,
                 (vector<int,_std::allocator<int>_> *)&pos);
      vVar2 = game(0x7e4,(vector<int,_std::allocator<int>_> *)local_2e8);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_2e8);
      local_2cc = vVar2;
      poVar3 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2cc);
      std::operator<<(poVar3,"\n");
      std::vector<int,_std::allocator<int>_>::vector
                (&local_308,(vector<int,_std::allocator<int>_> *)&pos);
      vVar2 = game(30000000,&local_308);
      std::vector<int,_std::allocator<int>_>::~vector(&local_308);
      local_2ec = vVar2;
      poVar3 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2ec);
      std::operator<<(poVar3,"\n");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2cc);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2ec);
      std::operator<<(poVar3,"\n");
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&pos);
      std::__cxx11::string::~string
                ((string *)
                 &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    std::ifstream::~ifstream(local_220);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Provide input file\n");
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Provide input file\n";
    return 0;
  }

  auto file = std::ifstream (argv[1]);

  if (!file.good()) {
    std::cerr << "Could not open file\n";
    return 1;
  }

  std::string input;
  std::getline(file, input);

  std::vector<int> numbers;

  size_t pos = 0;
  for(auto to = input.find(','); to != std::string::npos; to = input.find(',', pos)) {
    numbers.push_back(std::stoi(input.substr(pos, to - pos)));
    pos = to + 1;
  }
  numbers.push_back(std::stoi(input.substr(pos)));

  auto a1 = game(2020, numbers);
  std::cout << "Part 1: " << a1 << "\n";

  auto a2 = game(30000000, numbers);
  std::cout << "Part 2: " << a2 << "\n";

  std::cout << a1 << "\n" << a2 << "\n";
}